

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkAndJumpListHandler.cpp
# Opt level: O0

void __thiscall
ShellLinkAndJumpListHandler::parseLNKStruct
          (ShellLinkAndJumpListHandler *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *headerValue)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int local_8c;
  int remainder;
  int offsetEnd;
  ShellLink shellLink;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  undefined1 local_30 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *headerValue_local;
  ShellLinkAndJumpListHandler *this_local;
  
  local_30._24_8_ = headerValue;
  headerValue_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  ReadStream::read((ReadStream *)local_30,(int)this->rs,(void *)(ulong)(this->startPosition + 4),4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (headerValue,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_48,headerValue);
  iVar2 = Utils::lenFourBytesChar(&local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_48);
  if (iVar2 == 0x1140200) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ShellLink structure ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->countOfShellLink + 1);
    std::operator<<(poVar3,"]: ");
    memset(&remainder,0,8);
    ShellLink::ShellLink((ShellLink *)&remainder);
    ShellLink::parseShellLinkStructure((ShellLink *)&remainder,this->rs,this->startPosition);
    local_8c = ShellLink::getShellLinkOffsetEnd((ShellLink *)&remainder);
    if (local_8c % 0x10 == 0) {
      local_8c = local_8c + -4;
    }
    else {
      local_8c = (local_8c + 0xc) - local_8c % 0x10;
    }
    this->startPosition = local_8c;
    this->countOfShellLink = this->countOfShellLink + 1;
    bVar1 = ShellLink::isThisShellLinkHasErrors((ShellLink *)&remainder);
    if (bVar1) {
      this->countOfShellLinkWithErrors = this->countOfShellLinkWithErrors + 1;
    }
    ShellLink::resetAllFlags((ShellLink *)&remainder);
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    this->startPosition = this->startPosition + 4;
  }
  return;
}

Assistant:

void ShellLinkAndJumpListHandler::parseLNKStruct(std::vector<unsigned char> headerValue) {
    /* Decode ShellLink Stream = CustDest Jump List */
    headerValue =  rs->read(startPosition + 4,4);
    if (Utils::lenFourBytesChar(headerValue) != 0x01140200) { // Если следующее поле не CLSID -> ищем структуры далее
        startPosition += 4;
        return;
    }
    cout << "[ShellLink structure " << dec << countOfShellLink + 1 << "]: ";
    ShellLink shellLink = ShellLink();
    shellLink.parseShellLinkStructure(rs, startPosition);
    int offsetEnd = shellLink.getShellLinkOffsetEnd();
    int remainder = offsetEnd % 16;
    startPosition = remainder == 0 ? offsetEnd - 4 : offsetEnd + 12 - remainder;  // так как в while будет + 4
    ++countOfShellLink;
    if(shellLink.isThisShellLinkHasErrors())
        ++countOfShellLinkWithErrors;
    shellLink.resetAllFlags();
    cout << endl << endl << endl;
    return;
}